

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_input.hpp
# Opt level: O2

void __thiscall
tao::pegtl::
string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
string_input<std::__cxx11::string_const&,char_const(&)[6]>
          (string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_data,
          char (*in_source) [6])

{
  std::__cxx11::string::string((string *)this,(string *)in_data);
  internal::
  memory_input_base<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
  ::memory_input_base<char_const(&)[6]>
            ((memory_input_base<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
              *)(this + 0x20),*(char **)this,*(char **)this + *(long *)(this + 8),in_source);
  return;
}

Assistant:

explicit string_input( V&& in_data, T&& in_source, Ts&&... ts )
            : internal::string_holder( std::forward< V >( in_data ) ),
              memory_input< P, Eol, Source >( data.data(), data.size(), std::forward< T >( in_source ), std::forward< Ts >( ts )... )
         {
         }